

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_scatter2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv)

{
  undefined8 *puVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  C_Integer *pCVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Integer IVar11;
  int _i;
  int iVar12;
  void *__ptr;
  logical lVar13;
  undefined8 *puVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined4 uVar19;
  long lVar20;
  ulong uVar21;
  void **ppvVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  Integer IVar26;
  long icode;
  long lVar27;
  long lVar28;
  global_array_t *pgVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  C_Integer CVar35;
  long lVar36;
  void *pvVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  bool bVar41;
  long local_2a0;
  armci_giov_t desc;
  Integer hi [2];
  Integer lo [2];
  Integer subscrpt [2];
  Integer _lo [2];
  char err_string [256];
  
  if (0 < nv) {
    lVar40 = g_a + 1000;
    iVar12 = GA[g_a + 1000].type;
    if ((g_a < -1000) || (_max_global_array <= lVar40)) {
      sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_scatter");
      pnga_error(err_string,g_a);
    }
    if (GA[lVar40].actv == 0) {
      sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_scatter");
      pnga_error(err_string,g_a);
    }
    GAstat.numsca = GAstat.numsca + 1;
    iVar5 = GA[lVar40].p_handle;
    lVar25 = (long)iVar5;
    if (lVar25 < 0) {
      lVar38 = GA[lVar40].num_rstrctd;
      if (GA[lVar40].num_rstrctd < 1) {
        lVar38 = GAnproc;
      }
    }
    else {
      lVar38 = (long)PGRP_LIST[lVar25].map_nproc;
    }
    if (GA[lVar40].distr_type == 0) {
      __ptr = malloc((nv << 0x20) + (lVar38 << 0x22) >> 0x1d);
      local_2a0 = 0;
      lVar28 = lVar38;
    }
    else {
      lVar28 = GA[lVar40].block_total;
      __ptr = malloc((nv << 0x20) + (lVar28 << 0x22) >> 0x1d);
      local_2a0 = lVar28;
    }
    if (__ptr == (void *)0x0) {
      pnga_error("malloc failed",lVar28 * 3);
      __ptr = (void *)0x0;
    }
    pgVar29 = GA;
    puVar1 = (undefined8 *)((long)__ptr + nv * 8);
    if (GA[lVar40].distr_type == 0) {
      lVar28 = 0;
      puVar14 = puVar1;
      if (0 < lVar38) {
        lVar28 = lVar38;
      }
      while (lVar9 = lVar38, lVar28 != 0) {
        *puVar14 = 0;
        puVar14[lVar38] = 0;
        lVar28 = lVar28 + -1;
        puVar14 = puVar14 + 1;
      }
    }
    else {
      lVar28 = 0;
      puVar14 = puVar1;
      if (0 < local_2a0) {
        lVar28 = local_2a0;
      }
      while (lVar9 = local_2a0, lVar28 != 0) {
        *puVar14 = 0;
        puVar14[local_2a0] = 0;
        lVar28 = lVar28 + -1;
        puVar14 = puVar14 + 1;
      }
    }
    if (pgVar29[lVar40].num_rstrctd == 0) {
      lVar28 = 0;
      IVar26 = nv;
      while (bVar41 = IVar26 != 0, IVar26 = IVar26 + -1, pgVar29 = GA, bVar41) {
        subscrpt[0] = *(Integer *)((long)i + lVar28);
        subscrpt[1] = *(Integer *)((long)j + lVar28);
        lVar13 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar28));
        if (lVar13 == 0) {
          sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar28),
                  *(undefined8 *)((long)j + lVar28));
          pnga_error(err_string,g_a);
        }
        puVar1[lVar9 + *(Integer *)((long)__ptr + lVar28)] =
             puVar1[lVar9 + *(Integer *)((long)__ptr + lVar28)] + 1;
        lVar28 = lVar28 + 8;
      }
    }
    else {
      lVar28 = 0;
      IVar26 = nv;
      while (bVar41 = IVar26 != 0, IVar26 = IVar26 + -1, bVar41) {
        subscrpt[0] = *(Integer *)((long)i + lVar28);
        subscrpt[1] = *(Integer *)((long)j + lVar28);
        lVar13 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar28));
        if (lVar13 == 0) {
          sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar28),
                  *(undefined8 *)((long)j + lVar28));
          pnga_error(err_string,g_a);
        }
        pgVar29 = GA;
        puVar1[lVar9 + GA[lVar40].rank_rstrctd[*(Integer *)((long)__ptr + lVar28)]] =
             puVar1[lVar9 + GA[lVar40].rank_rstrctd[*(Integer *)((long)__ptr + lVar28)]] + 1;
        lVar28 = lVar28 + 8;
      }
    }
    iVar30 = pgVar29[lVar40].distr_type;
    if (iVar30 == 0) {
      icode = 0;
      lVar28 = 0;
      if (0 < lVar38) {
        lVar28 = lVar38;
      }
      for (lVar18 = 0; lVar28 != lVar18; lVar18 = lVar18 + 1) {
        if (0 < (long)puVar1[lVar9 + lVar18]) {
          puVar1[lVar9 * 2 + icode] = lVar18;
          puVar1[lVar9 * 3 + lVar18] = icode;
          icode = icode + 1;
        }
      }
    }
    else {
      icode = 0;
      if (local_2a0 < 1) {
        local_2a0 = icode;
      }
      for (lVar28 = 0; local_2a0 != lVar28; lVar28 = lVar28 + 1) {
        if (0 < (long)puVar1[lVar9 + lVar28]) {
          puVar1[lVar9 * 2 + icode] = lVar28;
          puVar1[lVar9 * 3 + lVar28] = icode;
          icode = icode + 1;
        }
      }
    }
    GAstat.numsca_procs = GAstat.numsca_procs + icode;
    lVar28 = nv * 0x10;
    puVar14 = (undefined8 *)malloc((long)((int)icode * 0x38 + (int)lVar28 + (int)(icode * 8)));
    if (puVar14 == (undefined8 *)0x0) {
      pnga_error("malloc failed",icode);
      iVar30 = GA[lVar40].distr_type;
      pgVar29 = GA;
    }
    pvVar37 = puVar14 + icode * 2;
    lVar18 = icode * 8 + lVar28;
    lVar24 = icode * 8 + lVar18;
    lVar36 = icode * 8 + lVar24;
    lVar23 = icode * 8 + lVar36;
    lVar10 = icode * 8 + lVar23;
    if (iVar30 == 0) {
      lVar39 = 0;
      if (0 < icode) {
        lVar39 = icode;
      }
      for (lVar27 = 0; lVar27 != lVar39; lVar27 = lVar27 + 1) {
        lVar17 = puVar1[lVar9 * 2 + lVar27];
        if (0 < pgVar29[lVar40].num_rstrctd) {
          lVar17 = pgVar29[lVar40].rstrctd_list[lVar17];
        }
        pnga_distribution(g_a,lVar17,lo,hi);
        *(Integer *)((long)pvVar37 + lVar27 * 8 + lVar18) = lo[0];
        *(Integer *)((long)pvVar37 + lVar27 * 8 + lVar36) = lo[1];
        *(Integer *)((long)pvVar37 + lVar27 * 8 + lVar24) = hi[0];
        *(Integer *)((long)pvVar37 + lVar27 * 8 + lVar23) = hi[1];
        pgVar29 = GA + lVar40;
        lVar17 = GA[lVar40].width[0];
        lVar8 = GA[lVar40].width[1];
        lVar32 = GA[lVar40].num_rstrctd;
        iVar30 = GA[lVar40].distr_type;
        if (iVar30 - 1U < 3) {
          sVar2 = pgVar29->ndim;
          lVar15 = puVar1[lVar9 * 2 + lVar27];
          lVar20 = (long)(int)lVar15 % pgVar29->num_blocks[0];
          uVar19 = (undefined4)lVar20;
          err_string[0] = (char)uVar19;
          err_string[1] = (char)((uint)uVar19 >> 8);
          err_string[2] = (char)((uint)uVar19 >> 0x10);
          err_string[3] = (char)((uint)uVar19 >> 0x18);
          lVar16 = 0;
          while (lVar16 + 1 < (long)sVar2) {
            lVar15 = (long)((int)lVar15 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar16];
            lVar20 = (long)(int)lVar15 % GA[g_a + 1000].num_blocks[lVar16 + 1];
            *(int *)(err_string + lVar16 * 4 + 4) = (int)lVar20;
            lVar16 = lVar16 + 1;
          }
          uVar31 = (uint)sVar2;
          if (sVar2 < 1) {
            uVar31 = 0;
          }
          for (uVar21 = 0; (uVar31 & 0xffff) << 2 != uVar21; uVar21 = uVar21 + 4) {
            iVar30 = *(int *)(err_string + uVar21);
            lVar15 = *(long *)((long)GA[g_a + 1000].block_dims + uVar21 * 2);
            *(long *)((long)_lo + uVar21 * 2) = lVar15 * iVar30 + 1;
            lVar15 = ((long)iVar30 + 1) * lVar15;
            lVar16 = *(long *)((long)GA[g_a + 1000].dims + uVar21 * 2);
            if (lVar16 <= lVar15) {
              lVar15 = lVar16;
            }
            *(long *)((long)&desc.src_ptr_array + uVar21 * 2) = lVar15;
          }
        }
        else if (iVar30 == 4) {
          sVar2 = pgVar29->ndim;
          lVar15 = puVar1[lVar9 * 2 + lVar27];
          lVar20 = (long)(int)lVar15 % pgVar29->num_blocks[0];
          uVar19 = (undefined4)lVar20;
          err_string[0] = (char)uVar19;
          err_string[1] = (char)((uint)uVar19 >> 8);
          err_string[2] = (char)((uint)uVar19 >> 0x10);
          err_string[3] = (char)((uint)uVar19 >> 0x18);
          lVar16 = 0;
          while (lVar16 + 1 < (long)sVar2) {
            lVar15 = (long)((int)lVar15 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar16];
            lVar20 = (long)(int)lVar15 % GA[g_a + 1000].num_blocks[lVar16 + 1];
            *(int *)(err_string + lVar16 * 4 + 4) = (int)lVar20;
            lVar16 = lVar16 + 1;
          }
          uVar21 = 0;
          uVar31 = (int)sVar2;
          if (sVar2 < 1) {
            uVar31 = 0;
          }
          iVar30 = 0;
          for (; (uVar31 & 0xffff) << 2 != uVar21; uVar21 = uVar21 + 4) {
            pCVar7 = GA[lVar40].mapc;
            iVar6 = *(int *)(err_string + uVar21);
            lVar16 = (long)iVar30 + (long)iVar6;
            *(C_Integer *)((long)_lo + uVar21 * 2) = pCVar7[lVar16];
            lVar15 = *(long *)((long)pgVar29->num_blocks + uVar21 * 2);
            if ((long)iVar6 < lVar15 + -1) {
              lVar16 = pCVar7[lVar16 + 1] + -1;
            }
            else {
              lVar16 = *(long *)((long)pgVar29->dims + uVar21 * 2);
            }
            *(long *)((long)&desc.src_ptr_array + uVar21 * 2) = lVar16;
            iVar30 = iVar30 + (int)lVar15;
          }
        }
        else if (iVar30 == 0) {
          if (lVar32 == 0) {
            uVar4 = pgVar29->ndim;
            if ((short)uVar4 < 1) {
              uVar4 = 0;
            }
            uVar21 = (ulong)uVar4;
            lVar15 = 1;
            for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
              lVar15 = lVar15 * GA[g_a + 1000].nblock[uVar33];
            }
            lVar16 = puVar1[lVar9 * 2 + lVar27];
            if (lVar16 < lVar15 && -1 < lVar16) {
              lVar15 = 0;
              for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
                lVar34 = (long)GA[g_a + 1000].nblock[uVar33];
                lVar20 = lVar16 % lVar34;
                pCVar7 = pgVar29->mapc;
                _lo[uVar33] = pCVar7[lVar20 + lVar15];
                if (lVar20 == lVar34 + -1) {
                  ppvVar22 = (void **)GA[g_a + 1000].dims[uVar33];
                }
                else {
                  ppvVar22 = (void **)(pCVar7[lVar20 + lVar15 + 1] + -1);
                }
                lVar15 = lVar15 + lVar34;
                (&desc.src_ptr_array)[uVar33] = ppvVar22;
                lVar16 = lVar16 / lVar34;
              }
            }
            else {
              for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
                _lo[uVar33] = 0;
                (&desc.src_ptr_array)[uVar33] = (void **)0xffffffffffffffff;
              }
            }
          }
          else {
            lVar15 = puVar1[lVar9 * 2 + lVar27];
            uVar3 = pgVar29->ndim;
            if ((short)uVar3 < 1) {
              uVar3 = 0;
            }
            uVar21 = (ulong)uVar3;
            if (lVar15 < lVar32) {
              lVar16 = 1;
              for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
                lVar16 = lVar16 * GA[g_a + 1000].nblock[uVar33];
              }
              if ((lVar15 < 0) || (lVar16 <= lVar15)) {
                for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
                  _lo[uVar33] = 0;
                  (&desc.src_ptr_array)[uVar33] = (void **)0xffffffffffffffff;
                }
              }
              else {
                lVar16 = 0;
                for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
                  lVar34 = (long)GA[g_a + 1000].nblock[uVar33];
                  lVar20 = lVar15 % lVar34;
                  pCVar7 = pgVar29->mapc;
                  _lo[uVar33] = pCVar7[lVar20 + lVar16];
                  if (lVar20 == lVar34 + -1) {
                    ppvVar22 = (void **)GA[g_a + 1000].dims[uVar33];
                  }
                  else {
                    ppvVar22 = (void **)(pCVar7[lVar20 + lVar16 + 1] + -1);
                  }
                  lVar16 = lVar16 + lVar34;
                  (&desc.src_ptr_array)[uVar33] = ppvVar22;
                  lVar15 = lVar15 / lVar34;
                }
              }
            }
            else {
              for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
                _lo[uVar33] = 0;
                (&desc.src_ptr_array)[uVar33] = (void **)0xffffffffffffffff;
              }
            }
          }
        }
        IVar11 = _lo[1];
        IVar26 = _lo[0];
        ppvVar22 = desc.src_ptr_array;
        if (pgVar29->p_handle == 0) {
          CVar35 = (C_Integer)PGRP_LIST->inv_map_proc_list[puVar1[lVar9 * 2 + lVar27]];
        }
        else {
          CVar35 = puVar1[lVar9 * 2 + lVar27];
          if (lVar32 != 0) {
            CVar35 = pgVar29->rstrctd_list[CVar35];
          }
        }
        lVar32 = *(long *)((long)pvVar37 + lVar27 * 8 + lVar18);
        lVar15 = *(long *)((long)pvVar37 + lVar27 * 8 + lVar36);
        if (((long)desc.src_ptr_array < lVar32 || lVar32 < _lo[0]) ||
           ((long)desc.dst_ptr_array < lVar15 || lVar15 < _lo[1])) {
          sprintf(err_string,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation");
          pnga_error(err_string,g_a);
          lVar32 = *(long *)((long)pvVar37 + lVar27 * 8 + lVar18);
          lVar15 = *(long *)((long)pvVar37 + lVar27 * 8 + lVar36);
        }
        pgVar29 = GA;
        lVar16 = ((lVar17 * 2 + 1) - IVar26) + (long)ppvVar22;
        *(char **)((long)pvVar37 + lVar27 * 8 + lVar28) =
             GA[lVar40].ptr[CVar35] +
             ((lVar17 - IVar26) + lVar32 + ((lVar8 - IVar11) + lVar15) * lVar16) *
             *(long *)(BYTE_ARRAY_001d8471 + (long)GA[lVar40].type * 0x10 + 0x127);
        *(long *)((long)pvVar37 + lVar27 * 8 + lVar10) = lVar16;
      }
    }
    else {
      lVar27 = 0;
      lVar39 = 0;
      if (0 < icode) {
        lVar39 = icode;
      }
      while (bVar41 = lVar39 != 0, lVar39 = lVar39 + -1, bVar41) {
        IVar26 = *(Integer *)((long)puVar1 + lVar27 + lVar9 * 0x10);
        pnga_distribution(g_a,IVar26,lo,hi);
        *(Integer *)((long)pvVar37 + lVar27 + lVar18) = lo[0];
        *(Integer *)((long)pvVar37 + lVar27 + lVar36) = lo[1];
        *(Integer *)((long)pvVar37 + lVar27 + lVar24) = hi[0];
        *(Integer *)((long)pvVar37 + lVar27 + lVar23) = hi[1];
        pnga_access_block_ptr
                  (g_a,IVar26,(void *)((long)pvVar37 + lVar27 + lVar28),
                   (Integer *)((long)pvVar37 + lVar27 + lVar10));
        lVar27 = lVar27 + 8;
      }
    }
    lVar39 = *(long *)(BYTE_ARRAY_001d8471 + (long)iVar12 * 0x10 + 0x127);
    GAbytes.scatot = (double)lVar39 * (double)nv + GAbytes.scatot;
    GAbytes.scaloc =
         (double)lVar39 * (double)(long)puVar1[lVar9 + *(long *)((long)__ptr + GAme * 8)] +
         GAbytes.scaloc;
    *puVar14 = pvVar37;
    puVar14[icode] = (void *)((long)pvVar37 + nv * 8);
    for (lVar27 = 1; lVar27 < icode; lVar27 = lVar27 + 1) {
      lVar17 = puVar1[lVar9 + puVar1[lVar9 * 2 + lVar27 + -1]];
      puVar14[lVar27] = puVar14[lVar27 + -1] + lVar17 * 8;
      puVar14[icode + lVar27] = lVar17 * 8 + puVar14[icode + lVar27 + -1];
    }
    for (lVar27 = 0; nv != lVar27; lVar27 = lVar27 + 1) {
      lVar17 = *(long *)((long)__ptr + lVar27 * 8);
      if (0 < GA[lVar40].num_rstrctd) {
        lVar17 = GA[lVar40].rank_rstrctd[lVar17];
      }
      lVar8 = puVar1[lVar17];
      puVar1[lVar17] = lVar8 + 1;
      uVar21 = puVar1[lVar9 * 3 + lVar17];
      *(void **)(puVar14[uVar21] + lVar8 * 8) = v;
      lVar17 = i[lVar27];
      lVar32 = *(long *)((long)pvVar37 + uVar21 * 8 + lVar18);
      lVar15 = *(long *)((long)pvVar37 + uVar21 * 8 + lVar24);
      if ((lVar17 < lVar32) || (lVar15 < lVar17)) {
LAB_00174810:
        sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",uVar21 & 0xffffffff,
                lVar17,j[lVar27],lVar32,lVar15,*(undefined8 *)((long)pvVar37 + uVar21 * 8 + lVar36),
                *(undefined8 *)((long)pvVar37 + uVar21 * 8 + lVar23));
        pnga_error(err_string,g_a);
        lVar16 = j[lVar27];
        lVar20 = *(long *)((long)pvVar37 + uVar21 * 8 + lVar36);
        lVar17 = i[lVar27];
        lVar32 = *(long *)((long)pvVar37 + uVar21 * 8 + lVar18);
      }
      else {
        lVar16 = j[lVar27];
        lVar20 = *(long *)((long)pvVar37 + uVar21 * 8 + lVar36);
        if ((lVar16 < lVar20) || (*(long *)((long)pvVar37 + uVar21 * 8 + lVar23) < lVar16))
        goto LAB_00174810;
      }
      *(long *)(puVar14[icode + uVar21] + lVar8 * 8) =
           (((lVar16 - lVar20) * *(long *)((long)pvVar37 + uVar21 * 8 + lVar10) + lVar17) - lVar32)
           * lVar39 + *(long *)((long)pvVar37 + uVar21 * 8 + lVar28);
      v = (void *)((long)v + lVar39);
    }
    iVar12 = (int)lVar39;
    switch(GA[lVar40].distr_type) {
    case 0:
      lVar28 = 0;
      lVar38 = icode;
      if (icode < 1) {
        lVar38 = lVar28;
      }
      for (; lVar38 != lVar28; lVar28 = lVar28 + 1) {
        desc.src_ptr_array = (void **)puVar14[lVar28];
        desc.dst_ptr_array = (void **)puVar14[icode + lVar28];
        uVar21 = puVar1[lVar9 * 2 + lVar28];
        desc.ptr_array_len = *(int *)(puVar1 + lVar9 + uVar21);
        if (iVar5 < 0) {
          if (0 < GA[lVar40].num_rstrctd) {
            uVar21 = GA[lVar40].rstrctd_list[uVar21];
          }
        }
        else {
          uVar21 = (ulong)(uint)PGRP_LIST[lVar25].inv_map_proc_list[uVar21];
        }
        desc.bytes = iVar12;
        iVar30 = ARMCI_PutV(&desc,1,(int)uVar21);
        if (iVar30 != 0) {
          pnga_error("scatter failed in armci",(long)iVar30);
        }
      }
      break;
    case 1:
      lVar28 = 0;
      lVar40 = icode;
      if (icode < 1) {
        lVar40 = lVar28;
      }
      for (; lVar40 != lVar28; lVar28 = lVar28 + 1) {
        desc.src_ptr_array = (void **)puVar14[lVar28];
        desc.dst_ptr_array = (void **)puVar14[icode + lVar28];
        uVar21 = (long)puVar1[lVar9 * 2 + lVar28] % lVar38;
        desc.ptr_array_len = *(int *)(puVar1 + lVar9 + puVar1[lVar9 * 2 + lVar28]);
        if (-1 < iVar5) {
          uVar21 = (ulong)(uint)PGRP_LIST[lVar25].inv_map_proc_list[uVar21];
        }
        desc.bytes = iVar12;
        iVar30 = ARMCI_PutV(&desc,1,(int)uVar21);
        if (iVar30 != 0) {
          pnga_error("scatter failed in armci",(long)iVar30);
        }
      }
      break;
    case 2:
      lVar28 = 0;
      lVar38 = icode;
      if (icode < 1) {
        lVar38 = lVar28;
      }
      for (; lVar28 != lVar38; lVar28 = lVar28 + 1) {
        desc.src_ptr_array = (void **)puVar14[lVar28];
        desc.dst_ptr_array = (void **)puVar14[icode + lVar28];
        lVar18 = puVar1[lVar9 * 2 + lVar28];
        desc.ptr_array_len = *(int *)(puVar1 + lVar9 + lVar18);
        sVar2 = GA[lVar40].ndim;
        uVar31 = (uint)sVar2;
        lVar23 = (long)(int)lVar18 % GA[lVar40].num_blocks[0];
        lVar24 = lVar23;
        lVar36 = 0;
        while (lVar36 + 1 < (long)(int)uVar31) {
          lVar18 = ((int)lVar18 - lVar24) / GA[g_a + 1000].num_blocks[lVar36];
          lVar24 = (long)(int)lVar18 % GA[g_a + 1000].num_blocks[lVar36 + 1];
          *(long *)(err_string + lVar36 * 8 + 8) = lVar24;
          lVar36 = lVar36 + 1;
        }
        err_string._0_8_ = lVar23 % (long)GA[lVar40].nblock[0];
        err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar40].nblock[1];
        uVar21 = 0;
        if (0 < sVar2) {
          uVar21 = (ulong)uVar31;
        }
        for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
          _lo[uVar33] = *(long *)(err_string + uVar33 * 8) % (long)GA[lVar40].nblock[uVar33];
        }
        uVar21 = _lo[(long)(int)uVar31 + -1];
        for (uVar31 = uVar31 - 2; -1 < (int)uVar31; uVar31 = uVar31 - 1) {
          uVar21 = uVar21 * (long)GA[lVar40].nblock[uVar31] + _lo[uVar31];
        }
        if (-1 < iVar5) {
          uVar21 = (ulong)(uint)PGRP_LIST[lVar25].inv_map_proc_list[uVar21];
        }
        desc.bytes = iVar12;
        iVar30 = ARMCI_PutV(&desc,1,(int)uVar21);
        if (iVar30 != 0) {
          pnga_error("scatter failed in armci",(long)iVar30);
        }
      }
      break;
    case 3:
    case 4:
      lVar28 = 0;
      lVar38 = icode;
      if (icode < 1) {
        lVar38 = lVar28;
      }
      for (; lVar28 != lVar38; lVar28 = lVar28 + 1) {
        desc.src_ptr_array = (void **)puVar14[lVar28];
        desc.dst_ptr_array = (void **)puVar14[icode + lVar28];
        lVar18 = puVar1[lVar9 * 2 + lVar28];
        desc.ptr_array_len = *(int *)(puVar1 + lVar9 + lVar18);
        sVar2 = GA[lVar40].ndim;
        uVar31 = (uint)sVar2;
        lVar23 = (long)(int)lVar18 % GA[lVar40].num_blocks[0];
        lVar24 = lVar23;
        lVar36 = 0;
        while (lVar36 + 1 < (long)(int)uVar31) {
          lVar18 = ((int)lVar18 - lVar24) / GA[g_a + 1000].num_blocks[lVar36];
          lVar24 = (long)(int)lVar18 % GA[g_a + 1000].num_blocks[lVar36 + 1];
          *(long *)(err_string + lVar36 * 8 + 8) = lVar24;
          lVar36 = lVar36 + 1;
        }
        err_string._0_8_ = lVar23 % (long)GA[lVar40].nblock[0];
        err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar40].nblock[1];
        uVar21 = 0;
        if (0 < sVar2) {
          uVar21 = (ulong)uVar31;
        }
        for (uVar33 = 0; uVar21 != uVar33; uVar33 = uVar33 + 1) {
          _lo[uVar33] = *(long *)(err_string + uVar33 * 8) % (long)GA[lVar40].nblock[uVar33];
        }
        uVar21 = _lo[(long)(int)uVar31 + -1];
        for (uVar31 = uVar31 - 2; -1 < (int)uVar31; uVar31 = uVar31 - 1) {
          uVar21 = uVar21 * (long)GA[lVar40].nblock[uVar31] + _lo[uVar31];
        }
        if (-1 < iVar5) {
          uVar21 = (ulong)(uint)PGRP_LIST[lVar25].inv_map_proc_list[uVar21];
        }
        desc.bytes = iVar12;
        iVar30 = ARMCI_PutV(&desc,1,(int)uVar21);
        if (iVar30 != 0) {
          pnga_error("scatter failed in armci",(long)iVar30);
        }
      }
    }
    free(puVar14);
    free(__ptr);
  }
  return;
}

Assistant:

void pnga_scatter2d(Integer g_a, void *v, Integer *i, Integer *j, Integer nv)
{
    register Integer k;
    Integer kk;
    Integer item_size;
    Integer proc, type=GA[GA_OFFSET + g_a].type;
    Integer nproc, p_handle, iproc;
    Integer subscrpt[2];

    Integer *aproc, naproc; /* active processes and numbers */
    Integer *map;           /* map the active processes to allocated space */
    char *buf1, *buf2;
    Integer handle = g_a + GA_OFFSET;
    
    Integer *count;   /* counters for each process */
    Integer *nelem;   /* number of elements for each process */
    /* source and destination pointers for each process */
    void ***ptr_src, ***ptr_dst; 
    void **ptr_org; /* the entire pointer array */
    armci_giov_t desc;
    Integer *ilo, *ihi, *jlo, *jhi, *ldp, *owner;
    Integer lo[2], hi[2];
    char **ptr_ref;
    Integer num_blocks=0;
    
    if (nv < 1) return;
    
    ga_check_handleM(g_a, "ga_scatter");
    
    GAstat.numsca++;
    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nproc = GAnproc;
      if (GA[handle].num_rstrctd > 0) {
        nproc = GA[handle].num_rstrctd;
      }
    } else {
      nproc = PGRP_LIST[p_handle].map_nproc;
    }
    
    /* allocate temp memory */
    if (GA[handle].distr_type == REGULAR) {
      buf1 = malloc((int) (nproc *4 +nv)* (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*nproc);
    } else {
      num_blocks = GA[handle].block_total;
      buf1 = malloc((int) (num_blocks *4 +nv)* (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*num_blocks);
    }
   
    owner = (Integer *)buf1;  
    count = owner+ nv;  
    if (GA[handle].distr_type == REGULAR) {
      nelem =  count + nproc;  
      aproc = count + 2 * nproc;  
      map = count + 3 * nproc;  
    } else {
      nelem =  count + num_blocks;  
      aproc = count + 2 * num_blocks;  
      map = count + 3 * num_blocks;  
    }

    /* initialize the counters and nelem */
    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<nproc; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    } else {
      for(kk=0; kk<num_blocks; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    }
    
    /* find proc that owns the (i,j) element; store it in temp:  */
    if (GA[handle].num_rstrctd == 0) {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string,g_a);
        }
        iproc = owner[k];
        nelem[iproc]++;
      }
    } else {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string,g_a);
        }
        iproc = GA[handle].rank_rstrctd[owner[k]];
        nelem[iproc]++;
      }
    }

    naproc = 0;
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<nproc; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    } else {
      for(k=0; k<num_blocks; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    }
    
    GAstat.numsca_procs += naproc;

    buf2 = malloc((int)(2*naproc*sizeof(void **) + 2*nv*sizeof(void *) +
                      5*naproc*sizeof(Integer) + naproc*sizeof(char*)));
    if(buf2 == NULL) pnga_error("malloc failed", naproc);
 
    ptr_src = (void ***)buf2;
    ptr_dst = (void ***)(buf2 + naproc*sizeof(void **));
    ptr_org = (void **)(buf2 + 2*naproc*sizeof(void **));
    ptr_ref = (char **)(buf2+2*naproc*sizeof(void **)+2*nv*sizeof(void *));
    ilo = (Integer *)(((char*)ptr_ref) + naproc*sizeof(char*));
    ihi = ilo + naproc;
    jlo = ihi + naproc;
    jhi = jlo + naproc;
    ldp = jhi + naproc;

    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        if (GA[handle].num_rstrctd > 0)
                    iproc = GA[handle].rstrctd_list[iproc];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        gaShmemLocation(aproc[kk], g_a, ilo[kk], jlo[kk], &(ptr_ref[kk]),
            &(ldp[kk]));
      }
    } else {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        pnga_access_block_ptr(g_a, iproc, &(ptr_ref[kk]), &(ldp[kk]));
        pnga_release_block(g_a, iproc);
      }
    }
    
    /* determine limit for message size --  v,i, & j will travel together */
    item_size = GAsizeofM(type);
    GAbytes.scatot += (double)item_size*nv ;
    iproc = owner[GAme];
    GAbytes.scaloc += (double)item_size* nelem[iproc];
    ptr_src[0] = ptr_org; ptr_dst[0] = ptr_org + nv;
    for(k=1; k<naproc; k++) {
        ptr_src[k] = ptr_src[k-1] + nelem[aproc[k-1]];
        ptr_dst[k] = ptr_dst[k-1] + nelem[aproc[k-1]];
    }
    
    for(k=0; k<nv; k++){
        Integer this_count;
        proc = owner[k];
        if (GA[handle].num_rstrctd > 0)
                    proc = GA[handle].rank_rstrctd[owner[k]];
        this_count = count[proc]; 
        count[proc]++;
        proc = map[proc];
        ptr_src[proc][this_count] = ((char*)v) + k * item_size;

        if(i[k] < ilo[proc] || i[k] > ihi[proc]  ||
           j[k] < jlo[proc] || j[k] > jhi[proc]){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",
             (int)proc, (long)i[k], (long)j[k], (long)ilo[proc], 
             (long)ihi[proc], (long)jlo[proc], (long)jhi[proc]);
            pnga_error(err_string, g_a);
        }
        ptr_dst[proc][this_count] = ptr_ref[proc] + item_size *
            ((j[k] - jlo[proc])* ldp[proc] + i[k] - ilo[proc]);
    }
    
    /* source and destination pointers are ready for all processes */
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        if (p_handle < 0) {
          iproc = aproc[k];
          if (GA[handle].num_rstrctd > 0)
            iproc = GA[handle].rstrctd_list[iproc];
        } else {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[aproc[k]];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        iproc = iproc%nproc;
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_proc_from_sl_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_tile_proc_from_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    }

    free(buf2);
    free(buf1);

}